

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O0

my_set<unsigned_long> * __thiscall
merlin::my_set<unsigned_long>::operator/
          (my_set<unsigned_long> *__return_storage_ptr__,my_set<unsigned_long> *this,
          unsigned_long *b)

{
  unsigned_long *__first2;
  unsigned_long *__last2;
  size_t sVar1;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_78;
  unsigned_long *local_70;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_68;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  unsigned_long *local_58;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50;
  iterator dend;
  unsigned_long local_38;
  size_t local_30;
  size_t n;
  unsigned_long *local_20;
  unsigned_long *b_local;
  my_set<unsigned_long> *this_local;
  my_set<unsigned_long> *d;
  
  n._7_1_ = 0;
  local_20 = b;
  b_local = (unsigned_long *)this;
  this_local = __return_storage_ptr__;
  my_set(__return_storage_ptr__,10);
  local_30 = size(this);
  local_38 = 0;
  resize(__return_storage_ptr__,local_30,&local_38);
  __gnu_cxx::
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  __normal_iterator(&local_50);
  local_60._M_current = (unsigned_long *)begin(this);
  local_68._M_current = (unsigned_long *)end(this);
  __first2 = local_20;
  __last2 = local_20 + 1;
  local_70 = (unsigned_long *)_begin(__return_storage_ptr__);
  local_58 = (unsigned_long *)
             std::
             set_difference<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_const*,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       (local_60,local_68,__first2,__last2,
                        (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         )local_70);
  local_50 = (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_58;
  local_78._M_current = (unsigned_long *)begin(__return_storage_ptr__);
  sVar1 = __gnu_cxx::operator-(&local_50,&local_78);
  (__return_storage_ptr__->super_my_vector<unsigned_long>).m_n = sVar1;
  update(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

my_set<T> my_set<T>::operator/(const T& b) const {
	my_set<T> d;
	size_t n = size();
	d.resize(n);                                    // reserve enough space
	typename my_set<T>::iterator dend;
	dend = std::set_difference(begin(), end(), &b, (&b) + 1, d._begin()); // use stl set function
	d.m_n = dend - d.begin();
	d.update();
	return d;
}